

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O2

xml_parse_result *
pugi::impl::anon_unknown_0::load_file_impl
          (xml_parse_result *__return_storage_ptr__,xml_document_struct *doc,FILE *file,uint options
          ,xml_encoding encoding,char_t **out_buffer)

{
  int iVar1;
  xml_encoding encoding_00;
  void *__ptr;
  size_t sVar2;
  stat st;
  
  if (file == (FILE *)0x0) {
    __return_storage_ptr__->encoding = encoding_auto;
    __return_storage_ptr__->status = status_file_not_found;
  }
  else {
    iVar1 = fileno((FILE *)file);
    iVar1 = fstat(iVar1,(stat *)&st);
    if (((iVar1 == 0) && ((st.st_mode & 0xf000) == 0x8000)) && (-1 < st.st_size)) {
      __ptr = (void *)(*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::
                                allocate)();
      if (__ptr == (void *)0x0) {
        __return_storage_ptr__->encoding = encoding_auto;
        __return_storage_ptr__->status = status_out_of_memory;
        goto LAB_00123065;
      }
      sVar2 = fread(__ptr,1,st.st_size,(FILE *)file);
      if (sVar2 == st.st_size) {
        encoding_00 = get_buffer_encoding(encoding,__ptr,st.st_size);
        if (encoding_00 == encoding_utf8) {
          *(undefined1 *)((long)__ptr + st.st_size) = 0;
          st.st_size = st.st_size + 1;
        }
        load_buffer_impl(__return_storage_ptr__,doc,&doc->super_xml_node_struct,__ptr,st.st_size,
                         options,encoding_00,true,true,out_buffer);
        return __return_storage_ptr__;
      }
      (*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::deallocate)
                (__ptr);
    }
    __return_storage_ptr__->encoding = encoding_auto;
    __return_storage_ptr__->status = status_io_error;
  }
LAB_00123065:
  __return_storage_ptr__->offset = 0;
  return __return_storage_ptr__;
}

Assistant:

PUGI_IMPL_FN xml_parse_result load_file_impl(xml_document_struct* doc, FILE* file, unsigned int options, xml_encoding encoding, char_t** out_buffer)
	{
		if (!file) return make_parse_result(status_file_not_found);

		// get file size (can result in I/O errors)
		size_t size = 0;
		xml_parse_status size_status = get_file_size(file, size);
		if (size_status != status_ok) return make_parse_result(size_status);

		size_t max_suffix_size = sizeof(char_t);

		// allocate buffer for the whole file
		char* contents = static_cast<char*>(xml_memory::allocate(size + max_suffix_size));
		if (!contents) return make_parse_result(status_out_of_memory);

		// read file in memory
		size_t read_size = fread(contents, 1, size, file);

		if (read_size != size)
		{
			xml_memory::deallocate(contents);
			return make_parse_result(status_io_error);
		}

		xml_encoding real_encoding = get_buffer_encoding(encoding, contents, size);

		return load_buffer_impl(doc, doc, contents, zero_terminate_buffer(contents, size, real_encoding), options, real_encoding, true, true, out_buffer);
	}